

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memcpy.c
# Opt level: O0

ssize_t mpt_memcpy(ssize_t len,iovec *src,size_t nsrc,iovec *dest,size_t ndest)

{
  iovec *local_70;
  size_t copy;
  size_t pos;
  size_t space;
  size_t left;
  size_t total;
  int8_t *target;
  int8_t *source;
  size_t ndest_local;
  iovec *dest_local;
  size_t nsrc_local;
  iovec *src_local;
  ssize_t len_local;
  
  if ((ndest == 0) || (nsrc == 0)) {
    return 0;
  }
  target = (int8_t *)src->iov_base;
  space = src->iov_len;
  total = (size_t)dest->iov_base;
  pos = dest->iov_len;
  if (0 < len) {
    left = space;
    for (copy = 1; copy < nsrc; copy = copy + 1) {
      left = src[copy].iov_len + left;
    }
    if ((long)left < len) {
      return -1;
    }
    left = pos;
    for (copy = 1; copy < ndest; copy = copy + 1) {
      left = dest[copy].iov_len + left;
    }
    if ((long)left < len) {
      return -2;
    }
  }
  left = 0;
  source = (int8_t *)ndest;
  ndest_local = (size_t)dest;
  dest_local = (iovec *)nsrc;
  nsrc_local = (size_t)src;
  src_local = (iovec *)len;
  while( true ) {
    while( true ) {
      if (src_local == (iovec *)0x0) {
        return left;
      }
      local_70 = src_local;
      if (space == 0) break;
      if (pos == 0) {
        source = source + -1;
        if (source == (int8_t *)0x0) {
          return left;
        }
        total = *(size_t *)(ndest_local + 0x10);
        pos = *(size_t *)(ndest_local + 0x18);
        ndest_local = ndest_local + 0x10;
      }
      else {
        if (space < src_local) {
          local_70 = (iovec *)space;
        }
        if (pos < local_70) {
          local_70 = (iovec *)pos;
        }
        memcpy((void *)total,target,(size_t)local_70);
        target = target + (long)&local_70->iov_base;
        space = space - (long)local_70;
        total = (long)&local_70->iov_base + total;
        pos = pos - (long)local_70;
        left = (long)&local_70->iov_base + left;
        src_local = (iovec *)((long)src_local - (long)local_70);
      }
    }
    dest_local = (iovec *)((long)&dest_local[-1].iov_len + 7);
    if (dest_local == (iovec *)0x0) break;
    target = *(int8_t **)(nsrc_local + 0x10);
    space = *(size_t *)(nsrc_local + 0x18);
    nsrc_local = (size_t)(nsrc_local + 0x10);
  }
  return left;
}

Assistant:

extern ssize_t mpt_memcpy(ssize_t len,
			  const struct iovec *src,  size_t nsrc,
			  const struct iovec *dest, size_t ndest)
{
	int8_t	*source, *target;
	size_t	total = 0, left, space;
	
	if (!ndest || !nsrc)
		return 0;
	
	source = src->iov_base;
	left   = src->iov_len;
	
	target = dest->iov_base;
	space  = dest->iov_len;
	
	/* check maximum size */
	if (len > 0) {
		size_t pos;
		for (total = left,  pos = 1; pos < nsrc;  ++pos) total += src[pos].iov_len;
		if (len > (ssize_t) total) return -1;
		for (total = space, pos = 1; pos < ndest; ++pos) total += dest[pos].iov_len;
		if (len > (ssize_t) total) return -2;
	}
	total = 0;
	
	while (len) {
		size_t copy = len;
		if (!left) {
			if (!(--nsrc)) break;
			++src;
			source = src->iov_base;
			left   = src->iov_len;
			continue;
		}
		if (!space) {
			if (!(--ndest)) break;
			++dest;
			target = dest->iov_base;
			space  = dest->iov_len;
			continue;
		}
		if (left  < copy) copy = left;
		if (space < copy) copy = space;
		
		memcpy(target, source, copy);
		
		source += copy;
		left   -= copy;
		
		target += copy;
		space  -= copy;
		
		total += copy;
		len   -= copy;
	}
	return total;
}